

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseFunctionOrStateVariable(StructuralParser *this)

{
  bool isExternal_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this_00;
  Function *o;
  Expression *pEVar4;
  ModuleBase *pMVar5;
  undefined4 extraout_var_00;
  anon_class_8_1_ee5ece24 local_1f8;
  Context local_1f0;
  Identifier local_1d8;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *local_1d0;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *stateVariables;
  undefined1 local_18a;
  undefined1 local_189;
  CompileMessage local_188;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_150;
  Identifier local_138;
  pool_ref<soul::AST::Function> local_130;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *local_128;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *functions;
  char *local_e8;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_e0;
  char *local_c8;
  undefined1 local_c0 [8];
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  genericWildcards;
  Identifier name;
  Context context;
  undefined1 local_50 [8];
  pool_ptr<soul::AST::Expression> type;
  bool isExternal;
  Context declarationContext;
  StructuralParser *this_local;
  undefined4 extraout_var;
  
  declarationContext.parentScope = (Scope *)this;
  getContext((Context *)&stack0xffffffffffffffd8,this);
  isExternal_00 =
       Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
       ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"external");
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,"static_assert");
  if (bVar1) {
    parseStaticAssert(this);
    type.object._0_4_ = 1;
  }
  else {
    tryParsingType((StructuralParser *)local_50,(ParseTypeContext)this);
    bVar1 = pool_ptr<soul::AST::Expression>::operator==
                      ((pool_ptr<soul::AST::Expression> *)local_50,(void *)0x0);
    if (bVar1) {
      Errors::expectedFunctionOrVariable<>();
      AST::Context::throwError
                ((Context *)&stack0xffffffffffffffd8,(CompileMessage *)&context.parentScope,false);
    }
    getContext((Context *)&name,this);
    genericWildcards.
    super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)parseIdentifier(this);
    std::
    vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ::vector((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
              *)local_c0);
    local_c8 = "<";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e539);
    if (bVar1) {
      parseGenericFunctionWildcardList(&local_e0,this);
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::operator=((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                   *)local_c0,&local_e0);
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::~vector(&local_e0);
    }
    local_e8 = "(";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
    if (bVar1) {
      if (isExternal_00) {
        Errors::functionCannotBeExternal<>();
        AST::Context::throwError
                  ((Context *)&stack0xffffffffffffffd8,(CompileMessage *)&functions,false);
      }
      pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
      iVar3 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[0xc])();
      this_00 = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                 *)CONCAT44(extraout_var,iVar3);
      local_128 = this_00;
      if (this_00 ==
          (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           *)0x0) {
        local_189 = 0;
        local_18a = 0;
        pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
        uVar2 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[5])();
        if ((uVar2 & 1) == 0) {
          Errors::noFunctionInThisScope<>();
          local_18a = 1;
        }
        else {
          Errors::graphCannotContainFunctions<>();
          local_189 = 1;
        }
        AST::Context::throwError((Context *)&stack0xffffffffffffffd8,&local_188,false);
      }
      pEVar4 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)local_50);
      local_138.name =
           (string *)
           genericWildcards.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::vector(&local_150,
               (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                *)local_c0);
      o = parseFunctionDeclaration
                    (this,(Context *)&stack0xffffffffffffffd8,pEVar4,local_138,(Context *)&name,
                     &local_150);
      pool_ref<soul::AST::Function>::pool_ref<soul::AST::Function,void>(&local_130,o);
      std::
      vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
      ::push_back(this_00,&local_130);
      pool_ref<soul::AST::Function>::~pool_ref(&local_130);
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::~vector(&local_150);
    }
    else {
      if (isExternal_00) {
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)local_50);
        iVar3 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[10])();
        if (iVar3 == 0) {
          Errors::noConstOnExternals<>();
          AST::Context::throwError
                    ((Context *)&stack0xffffffffffffffd8,(CompileMessage *)&stateVariables,false);
        }
      }
      pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
      iVar3 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[0xb])();
      local_1d0 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   *)CONCAT44(extraout_var_00,iVar3);
      pEVar4 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)local_50);
      local_1d8.name =
           (string *)
           genericWildcards.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      AST::Context::Context(&local_1f0,(Context *)&name);
      local_1f8.stateVariables = local_1d0;
      parseVariableDeclaration<soul::StructuralParser::parseFunctionOrStateVariable()::_lambda(soul::AST::VariableDeclaration&)_1_>
                (this,pEVar4,local_1d8,isExternal_00,&local_1f0,&local_1f8);
      AST::Context::~Context(&local_1f0);
    }
    std::
    vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ::~vector((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               *)local_c0);
    AST::Context::~Context((Context *)&name);
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_50);
    type.object._0_4_ = 0;
  }
  AST::Context::~Context((Context *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void parseFunctionOrStateVariable()
    {
        auto declarationContext = getContext();
        bool isExternal = matchIf (Keyword::external);

        if (matches ("static_assert"))
            return parseStaticAssert();

        auto type = tryParsingType (ParseTypeContext::variableType);

        if (type == nullptr)
            declarationContext.throwError (Errors::expectedFunctionOrVariable());

        auto context = getContext();
        auto name = parseIdentifier();

        std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards;

        if (matchIf (Operator::lessThan))
            genericWildcards = parseGenericFunctionWildcardList();

        if (matchIf (Operator::openParen))
        {
            if (isExternal)
                declarationContext.throwError (Errors::functionCannotBeExternal());

            if (auto functions = module->getFunctionList())
                functions->push_back (parseFunctionDeclaration (declarationContext, *type, name, context, genericWildcards));
            else
                declarationContext.throwError (module->isGraph() ? Errors::graphCannotContainFunctions()
                                                                 : Errors::noFunctionInThisScope());
        }
        else
        {
            if (isExternal && type->getConstness() == AST::Constness::definitelyConst)
                declarationContext.throwError (Errors::noConstOnExternals());

            auto& stateVariables = module->getStateVariableList();

            parseVariableDeclaration (*type, name, isExternal, context,
                                      [&] (AST::VariableDeclaration& v)  { stateVariables.push_back (v); });
        }
    }